

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> absl::Mul32(pair<unsigned_long,_unsigned_long> num,uint32_t mul)

{
  byte bVar1;
  uint in_EDX;
  ulong in_RSI;
  ulong in_RDI;
  uint64_t hi;
  uint64_t lo;
  uint shift;
  uint64_t bits128_up;
  uint64_t bits64_127;
  uint64_t bits0_63;
  uint64_t bits96_127;
  uint64_t bits64_95;
  uint64_t bits32_63;
  uint64_t bits0_31;
  unsigned_long local_78;
  unsigned_long local_70;
  type local_64;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_30 = (ulong)in_EDX * (in_RSI & 0xffffffff);
  local_38 = (ulong)in_EDX * (in_RSI >> 0x20);
  local_40 = (ulong)in_EDX * (in_RDI & 0xffffffff);
  local_48 = (ulong)in_EDX * (in_RDI >> 0x20);
  local_50 = local_30 + (local_38 << 0x20);
  local_58 = local_40 + (local_48 << 0x20) + (local_38 >> 0x20) + (ulong)(local_50 < local_30);
  local_60 = (local_48 >> 0x20) + (ulong)(local_58 < local_40);
  if (local_60 == 0) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_10,&local_58,&local_50);
  }
  else {
    local_64 = bit_width<unsigned_long>(0x3c3c1c);
    bVar1 = (byte)local_64;
    local_70 = (local_50 >> (bVar1 & 0x3f)) + (local_58 << (0x40 - bVar1 & 0x3f));
    local_78 = (local_58 >> (bVar1 & 0x3f)) + (local_60 << (0x40 - bVar1 & 0x3f));
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_10,&local_78,&local_70);
  }
  return local_10;
}

Assistant:

static std::pair<uint64_t, uint64_t> Mul32(std::pair<uint64_t, uint64_t> num,
                                           uint32_t mul) {
  uint64_t bits0_31 = num.second & 0xFFFFFFFF;
  uint64_t bits32_63 = num.second >> 32;
  uint64_t bits64_95 = num.first & 0xFFFFFFFF;
  uint64_t bits96_127 = num.first >> 32;

  // The picture so far: each of these 64-bit values has only the lower 32 bits
  // filled in.
  // bits96_127:          [ 00000000 xxxxxxxx ]
  // bits64_95:                    [ 00000000 xxxxxxxx ]
  // bits32_63:                             [ 00000000 xxxxxxxx ]
  // bits0_31:                                       [ 00000000 xxxxxxxx ]

  bits0_31 *= mul;
  bits32_63 *= mul;
  bits64_95 *= mul;
  bits96_127 *= mul;

  // Now the top halves may also have value, though all 64 of their bits will
  // never be set at the same time, since they are a result of a 32x32 bit
  // multiply.  This makes the carry calculation slightly easier.
  // bits96_127:          [ mmmmmmmm | mmmmmmmm ]
  // bits64_95:                    [ | mmmmmmmm mmmmmmmm | ]
  // bits32_63:                      |        [ mmmmmmmm | mmmmmmmm ]
  // bits0_31:                       |                 [ | mmmmmmmm mmmmmmmm ]
  // eventually:        [ bits128_up | ...bits64_127.... | ..bits0_63... ]

  uint64_t bits0_63 = bits0_31 + (bits32_63 << 32);
  uint64_t bits64_127 = bits64_95 + (bits96_127 << 32) + (bits32_63 >> 32) +
                        (bits0_63 < bits0_31);
  uint64_t bits128_up = (bits96_127 >> 32) + (bits64_127 < bits64_95);
  if (bits128_up == 0) return {bits64_127, bits0_63};

  auto shift = static_cast<unsigned>(bit_width(bits128_up));
  uint64_t lo = (bits0_63 >> shift) + (bits64_127 << (64 - shift));
  uint64_t hi = (bits64_127 >> shift) + (bits128_up << (64 - shift));
  return {hi, lo};
}